

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_write(mg_connection *conn,void *buf,size_t len)

{
  uint uVar1;
  uint uVar2;
  time_t tVar3;
  int in_R9D;
  uint uVar4;
  char *buf_00;
  int iVar5;
  SSL *ssl;
  
  if (conn == (mg_connection *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0xffffffff;
    if (len < 0x80000000) {
      conn->request_state = 10;
      iVar5 = (int)len;
      if (conn->throttle < 1) {
        uVar4 = push_all(conn->phys_ctx,(FILE *)(ulong)(uint)(conn->client).sock,(SOCKET)conn->ssl,
                         (SSL *)buf,(char *)(len & 0xffffffff),in_R9D);
      }
      else {
        tVar3 = time((time_t *)0x0);
        if (tVar3 != conn->last_throttle_time) {
          conn->last_throttle_time = tVar3;
          conn->last_throttle_bytes = 0;
        }
        uVar4 = conn->throttle - conn->last_throttle_bytes;
        buf_00 = (char *)(ulong)uVar4;
        if (iVar5 <= (int)uVar4) {
          buf_00 = (char *)(len & 0xffffffff);
        }
        uVar4 = push_all(conn->phys_ctx,(FILE *)(ulong)(uint)(conn->client).sock,(SOCKET)conn->ssl,
                         (SSL *)buf,buf_00,in_R9D);
        if ((uVar4 == (uint)buf_00) &&
           (conn->last_throttle_bytes = conn->last_throttle_bytes + uVar4, (int)uVar4 < iVar5)) {
          ssl = (SSL *)((long)buf + (long)(int)uVar4);
          do {
            if (conn->phys_ctx->stop_flag != 0) break;
            uVar1 = iVar5 - uVar4;
            if (conn->throttle < (int)(iVar5 - uVar4)) {
              uVar1 = conn->throttle;
            }
            uVar2 = push_all(conn->phys_ctx,(FILE *)(ulong)(uint)(conn->client).sock,
                             (SOCKET)conn->ssl,ssl,(char *)(ulong)uVar1,in_R9D);
            if (uVar2 != uVar1) break;
            sleep(1);
            conn->last_throttle_bytes = uVar1;
            tVar3 = time((time_t *)0x0);
            conn->last_throttle_time = tVar3;
            ssl = ssl + (int)uVar2;
            uVar4 = uVar4 + uVar2;
          } while ((int)uVar4 < iVar5);
        }
      }
      if (0 < (int)uVar4) {
        conn->num_bytes_sent = conn->num_bytes_sent + (ulong)uVar4;
      }
    }
  }
  return uVar4;
}

Assistant:

CIVETWEB_API int
mg_write(struct mg_connection *conn, const void *buf, size_t len)
{
	time_t now;
	int n, total, allowed;

	if (conn == NULL) {
		return 0;
	}
	if (len > INT_MAX) {
		return -1;
	}

	/* Mark connection as "data sent" */
	conn->request_state = 10;
#if defined(USE_HTTP2)
	if (conn->protocol_type == PROTOCOL_TYPE_HTTP2) {
		http2_data_frame_head(conn, len, 0);
	}
#endif

	if (conn->throttle > 0) {
		if ((now = time(NULL)) != conn->last_throttle_time) {
			conn->last_throttle_time = now;
			conn->last_throttle_bytes = 0;
		}
		allowed = conn->throttle - conn->last_throttle_bytes;
		if (allowed > (int)len) {
			allowed = (int)len;
		}

		total = push_all(conn->phys_ctx,
		                 NULL,
		                 conn->client.sock,
		                 conn->ssl,
		                 (const char *)buf,
		                 allowed);

		if (total == allowed) {

			buf = (const char *)buf + total;
			conn->last_throttle_bytes += total;
			while ((total < (int)len)
			       && STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
				allowed = (conn->throttle > ((int)len - total))
				              ? (int)len - total
				              : conn->throttle;

				n = push_all(conn->phys_ctx,
				             NULL,
				             conn->client.sock,
				             conn->ssl,
				             (const char *)buf,
				             allowed);

				if (n != allowed) {
					break;
				}
				sleep(1);
				conn->last_throttle_bytes = allowed;
				conn->last_throttle_time = time(NULL);
				buf = (const char *)buf + n;
				total += n;
			}
		}
	} else {
		total = push_all(conn->phys_ctx,
		                 NULL,
		                 conn->client.sock,
		                 conn->ssl,
		                 (const char *)buf,
		                 (int)len);
	}
	if (total > 0) {
		conn->num_bytes_sent += total;
	}
	return total;
}